

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cc
# Opt level: O0

bool bloaty::TryGetJumpTarget(cs_arch arch,cs_insn *in,uint64_t *target)

{
  int iVar1;
  undefined8 *in_RDX;
  int *in_RSI;
  int in_EDI;
  cs_x86_op op0;
  int local_48 [2];
  undefined8 local_40;
  undefined8 *local_18;
  bool local_1;
  
  if (in_EDI == 3) {
    iVar1 = *in_RSI;
    if (((iVar1 == 0x38) || (iVar1 - 0xfdU < 0x12)) || (iVar1 == 0x110)) {
      local_18 = in_RDX;
      memcpy(local_48,(void *)(*(long *)(in_RSI + 0x3c) + 0xa0),0x30);
      if (local_48[0] == 2) {
        *local_18 = local_40;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TryGetJumpTarget(cs_arch arch, cs_insn *in, uint64_t* target) {
  switch (arch) {
    case CS_ARCH_X86:
      switch (in->id) {
        case X86_INS_JAE:
        case X86_INS_JA:
        case X86_INS_JBE:
        case X86_INS_JB:
        case X86_INS_JCXZ:
        case X86_INS_JECXZ:
        case X86_INS_JE:
        case X86_INS_JGE:
        case X86_INS_JG:
        case X86_INS_JLE:
        case X86_INS_JL:
        case X86_INS_JMP:
        case X86_INS_JNE:
        case X86_INS_JNO:
        case X86_INS_JNP:
        case X86_INS_JNS:
        case X86_INS_JO:
        case X86_INS_JP:
        case X86_INS_JS:
        case X86_INS_CALL: {
          auto op0 = in->detail->x86.operands[0];
          if (op0.type == X86_OP_IMM) {
            *target = op0.imm;
            return true;
          }
          return false;
        }
        default:
          return false;
      }
    default:
      return false;
  }
}